

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Kss_Emu::run_clocks(Kss_Emu *this,blip_time_t *duration,int param_2)

{
  uint16_t uVar1;
  state_t *psVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  
  while( true ) {
    psVar2 = (this->super_Kss_Cpu).state;
    iVar4 = psVar2->base + psVar2->time;
    iVar5 = *duration;
    if (iVar5 <= iVar4) break;
    iVar4 = this->next_play;
    if (iVar5 < this->next_play) {
      iVar4 = iVar5;
    }
    Kss_Cpu::run(&this->super_Kss_Cpu,iVar4);
    uVar1 = (this->super_Kss_Cpu).r.pc;
    psVar2 = (this->super_Kss_Cpu).state;
    if (uVar1 == 0xffff) {
      iVar5 = psVar2->base;
      iVar4 = iVar4 - iVar5;
      psVar2->time = iVar4;
    }
    else {
      iVar5 = psVar2->base;
      iVar4 = psVar2->time;
    }
    if ((this->next_play <= iVar5 + iVar4) &&
       (this->next_play = this->next_play + this->play_period, uVar1 == 0xffff)) {
      if ((this->gain_updated == false) && (this->gain_updated = true, this->scc_accessed == true))
      {
        update_gain(this);
      }
      uVar3 = (this->super_Kss_Cpu).r.sp;
      this->ram[uVar3 - 1 & 0xffff] = 0xff;
      uVar3 = uVar3 - 2;
      (this->super_Kss_Cpu).r.sp = uVar3;
      this->ram[uVar3] = 0xff;
      (this->super_Kss_Cpu).r.pc = *(uint16_t *)(this->header_).super_header_t.play_addr;
    }
  }
  *duration = iVar4;
  this->next_play = this->next_play - iVar4;
  psVar2->time = psVar2->time - *duration;
  Ay_Apu::end_frame(&this->ay,*duration);
  Scc_Apu::end_frame(&this->scc,*duration);
  if (this->sn != (Sms_Apu *)0x0) {
    Sms_Apu::end_frame(this->sn,*duration);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Kss_Emu::run_clocks( blip_time_t& duration, int )
{
	while ( time() < duration )
	{
		blip_time_t end = min( duration, next_play );
		cpu::run( min( duration, next_play ) );
		if ( r.pc == idle_addr )
			set_time( end );
		
		if ( time() >= next_play )
		{
			next_play += play_period;
			if ( r.pc == idle_addr )
			{
				if ( !gain_updated )
				{
					gain_updated = true;
					if ( scc_accessed )
						update_gain();
				}
				
				ram [--r.sp] = idle_addr >> 8;
				ram [--r.sp] = idle_addr & 0xFF;
				r.pc = get_le16( header_.play_addr );
				GME_FRAME_HOOK( this );
			}
		}
	}
	
	duration = time();
	next_play -= duration;
	check( next_play >= 0 );
	adjust_time( -duration );
	ay.end_frame( duration );
	scc.end_frame( duration );
	if ( sn )
		sn->end_frame( duration );
	
	return 0;
}